

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetTXMarkerInfo(ndicapi *pol,int ph,int marker)

{
  char cVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = pol->TxHandleCount;
  lVar2 = 0;
  if (0 < (long)iVar3) {
    while ((uint)pol->TxHandles[lVar2] != ph) {
      lVar2 = lVar2 + 1;
      if (iVar3 == lVar2) {
        return 1;
      }
    }
  }
  if ((uint)marker < 0x14 && (int)lVar2 != iVar3) {
    cVar1 = pol->TxInformation[marker + 2][0];
    iVar3 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar3 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar3 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
      return 0;
    }
    return iVar3 + cVar1;
  }
  return 1;
}

Assistant:

ndicapiExport int ndiGetTXMarkerInfo(ndicapi* pol, int ph, int marker)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n || marker < 0 || marker >= 20)
  {
    return NDI_DISABLED;
  }

  dp = pol->TxInformation[2 + marker];
  return (int)ndiHexToUnsignedLong(dp, 1);
}